

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICharReader.cpp
# Opt level: O0

int ICharReader::readSpecialChar(ifstream *ifs,string *str)

{
  bool bVar1;
  int iVar2;
  streamoff sVar3;
  int local_5c;
  string local_58 [4];
  int i_1;
  int local_38;
  int local_34;
  int i;
  int base_len;
  undefined8 local_28;
  undefined4 local_20;
  char local_19;
  int base_pos;
  char tempChar;
  string *str_local;
  ifstream *ifs_local;
  
  _base_pos = str;
  str_local = (string *)ifs;
  _i = std::istream::tellg();
  sVar3 = std::fpos::operator_cast_to_long((fpos *)&i);
  local_20 = (undefined4)sVar3;
  local_34 = std::__cxx11::string::length();
  local_19 = std::istream::get();
  bVar1 = IDictionary::isSimpleTransfer(local_19);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)_base_pos,local_19);
  }
  else if (local_19 == 'x') {
    std::__cxx11::string::operator+=((string *)_base_pos,'x');
    for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
      local_19 = std::istream::get();
      bVar1 = IDictionary::isNumber16(local_19);
      if (!bVar1) {
        if (local_38 == 0) {
          std::__cxx11::string::substr((ulong)local_58,(ulong)_base_pos);
          std::__cxx11::string::operator=((string *)_base_pos,local_58);
          std::__cxx11::string::~string(local_58);
        }
        break;
      }
      std::__cxx11::string::operator+=((string *)_base_pos,local_19);
    }
  }
  else {
    bVar1 = IDictionary::isNumber8(local_19);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)_base_pos,local_19);
      for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
        local_19 = std::istream::get();
        bVar1 = IDictionary::isNumber8(local_19);
        if (!bVar1) break;
        std::__cxx11::string::operator+=((string *)_base_pos,local_19);
      }
    }
  }
  iVar2 = std::__cxx11::string::length();
  return iVar2 - local_34;
}

Assistant:

int ICharReader::readSpecialChar(std::ifstream *ifs,std::string &str) {
    char tempChar;
    int base_pos=ifs->tellg();
    int base_len=str.length();

    tempChar=ifs->get();
    if(IDictionary::isSimpleTransfer(tempChar))
    {
        str+=tempChar;
    }
    else if(tempChar=='x')
    {
        str+=tempChar;
        for(int i=0;i<3;i++)
        {
            tempChar=ifs->get();
            if(IDictionary::isNumber16(tempChar))
            {
                str+=tempChar;
            }
            else
            {
                if(i==0)
                    str=str.substr(0,base_len);
                break;
            }
        }
    }
    else if(IDictionary::isNumber8(tempChar))
    {
        str+=tempChar;
        for(int i=0;i<2;i++)
        {
            tempChar=ifs->get();
            if(IDictionary::isNumber8(tempChar))
            {
                str+=tempChar;
            }
            else
            {
                break;
            }
        }
    }
    return str.length()-base_len;
}